

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateFieldAccessor
               (FieldDescriptor *field,Options *options,Printer *printer)

{
  bool bVar1;
  uint uVar2;
  CppType CVar3;
  Type TVar4;
  FieldOptions *pFVar5;
  Descriptor *pDVar6;
  EnumDescriptor *pEVar7;
  char *pcVar8;
  AlphaNum *pAVar9;
  int32_t value_00;
  FieldDescriptor *field_00;
  int32_t value_01;
  int32_t value_02;
  undefined1 uVar10;
  AlphaNum *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string_view<char,_std::char_traits<char>_> *pbVar12;
  AlphaNum *in_R9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view name_06;
  string_view name_07;
  string_view local_a10;
  string_view local_a00;
  string local_9f0;
  string_view local_9d0;
  string_view local_9c0;
  string_view local_9b0;
  string_view local_9a0;
  string_view local_990;
  string_view local_980;
  string_view local_970;
  string local_960;
  string_view local_940;
  string_view local_930;
  string_view local_920;
  string local_910;
  string_view local_8f0;
  char *local_8e0;
  string_view local_8d8;
  string local_8c8;
  string_view local_8a8;
  string local_898;
  string_view local_878;
  string_view local_868;
  AlphaNum local_858;
  string local_828;
  AlphaNum local_808;
  string local_7d8;
  string_view local_7b8;
  AlphaNum local_7a8;
  string local_778;
  AlphaNum local_758;
  string local_728;
  string_view local_708;
  string_view local_6f8;
  string local_6e8;
  string_view local_6c8;
  string_view local_6b8;
  AlphaNum local_6a8;
  string local_678;
  AlphaNum local_658;
  string local_628;
  string_view local_608;
  AlphaNum local_5f8;
  string local_5c8;
  AlphaNum local_5a8;
  string local_578;
  string_view local_558;
  string_view local_548;
  string local_538;
  string_view local_518;
  string local_508;
  string_view local_4e8;
  FieldDescriptor *local_4d8;
  FieldDescriptor *value;
  FieldDescriptor *key;
  Descriptor *map_entry;
  string_view local_4b0;
  string local_4a0;
  string_view local_480;
  string_view local_470;
  string_view local_460;
  string local_450;
  string_view local_430;
  string local_420;
  string_view local_400;
  string_view local_3f0;
  string local_3e0;
  string_view local_3c0;
  string local_3b0;
  string_view local_390;
  string local_380;
  string_view local_360;
  string_view local_350;
  string_view local_340;
  string local_330;
  string_view local_310;
  string local_300;
  string_view local_2e0;
  string_view local_2d0;
  string local_2c0;
  string_view local_2a0;
  string local_290;
  string_view local_270;
  string local_260;
  string_view local_240;
  byte local_22a;
  allocator<char> local_229;
  AlphaNum local_228;
  AlphaNum local_1f8;
  AlphaNum local_1c8;
  byte local_192;
  byte local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  AlphaNum local_150;
  undefined1 local_120 [8];
  string deprecation_trigger_with_conditional;
  allocator<char> local_e9;
  AlphaNum local_e8;
  string_view local_b8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined1 local_48 [8];
  string deprecation_trigger;
  OneofDescriptor *oneof;
  Printer *printer_local;
  Options *options_local;
  FieldDescriptor *field_local;
  
  deprecation_trigger.field_2._8_8_ = FieldDescriptor::real_containing_oneof(field);
  GenerateFieldDocComment(printer,field,options,2);
  pFVar5 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::deprecated(pFVar5);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_78,"@trigger_error(\'");
    local_b8 = FieldDescriptor::name(field);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,local_b8);
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_e8," is deprecated.\', E_USER_DEPRECATED);\n        ");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_48,(lts_20250127 *)&local_78,&local_a8,&local_e8,in_R8);
    uVar10 = SUB81(in_R8,0);
  }
  else {
    std::allocator<char>::allocator();
    uVar10 = SUB81(in_R8,0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"",&local_e9);
    std::allocator<char>::~allocator(&local_e9);
  }
  pFVar5 = FieldDescriptor::options(field);
  local_191 = 0;
  local_192 = 0;
  local_22a = 0;
  bVar1 = FieldOptions::deprecated(pFVar5);
  if (bVar1) {
    php::(anonymous_namespace)::DeprecatedConditionalForField_abi_cxx11_
              (&local_190,(_anonymous_namespace_ *)field,field_00);
    local_191 = 1;
    std::operator+(&local_170,"if (",&local_190);
    local_192 = 1;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_150,&local_170);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1c8,") {\n            ");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_228,"}\n        ");
    pAVar9 = &local_228;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_120,(lts_20250127 *)&local_150,&local_1c8,&local_1f8,pAVar9,in_R9);
    uVar10 = SUB81(pAVar9,0);
  }
  else {
    std::allocator<char>::allocator();
    local_22a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"",&local_229);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator(&local_229);
  }
  if ((local_192 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_170);
  }
  if ((local_191 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_190);
  }
  if (deprecation_trigger.field_2._8_8_ == 0) {
    bVar1 = FieldDescriptor::has_presence(field);
    if ((bVar1) && (pDVar6 = FieldDescriptor::message_type(field), pDVar6 == (Descriptor *)0x0)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2a0,
                 "public function get^camel_name^()\n{\n    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ : ^default_value^;\n}\n\n"
                );
      local_2d0 = FieldDescriptor::name(field);
      name_00._M_len = local_2d0._M_str;
      name_00._M_str = (char *)0x1;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                (&local_2c0,(_anonymous_namespace_ *)local_2d0._M_len,name_00,(bool)uVar10);
      local_2e0 = FieldDescriptor::name(field);
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                (&local_300,(_anonymous_namespace_ *)field,(FieldDescriptor *)local_2e0._M_str);
      pbVar11 = &local_2c0;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string>
                (printer,local_2a0,(char (*) [11])0xa836ab,pbVar11,(char (*) [5])0xc259cc,&local_2e0
                 ,(char (*) [14])0xb940c7,&local_300,(char (*) [20])"deprecation_trigger",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      uVar10 = SUB81(pbVar11,0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_2c0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_310,
                 "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->^name^;\n}\n\n"
                );
      local_340 = FieldDescriptor::name(field);
      name_01._M_len = local_340._M_str;
      name_01._M_str = (char *)0x1;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)local_340._M_len,name_01,(bool)uVar10);
      local_350 = FieldDescriptor::name(field);
      pbVar11 = &local_330;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                (printer,local_310,(char (*) [11])0xa836ab,pbVar11,(char (*) [5])0xc259cc,&local_350
                 ,(char (*) [20])"deprecation_trigger",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      uVar10 = SUB81(pbVar11,0);
      std::__cxx11::string::~string((string *)&local_330);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_240,
               "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->readOneof(^number^);\n}\n\n"
              );
    local_270 = FieldDescriptor::name(field);
    name._M_len = local_270._M_str;
    name._M_str = (char *)0x1;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              (&local_260,(_anonymous_namespace_ *)local_270._M_len,name,(bool)uVar10);
    uVar2 = FieldDescriptor::number(field);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&local_290,(_anonymous_namespace_ *)(ulong)uVar2,value_00);
    pbVar11 = &local_260;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,local_240,(char (*) [11])0xa836ab,pbVar11,(char (*) [7])0xbe447d,&local_290,
               (char (*) [20])"deprecation_trigger",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    uVar10 = SUB81(pbVar11,0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if (deprecation_trigger.field_2._8_8_ == 0) {
    bVar1 = FieldDescriptor::has_presence(field);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3c0,
                 "public function has^camel_name^()\n{\n    ^deprecation_trigger_with_conditional^return isset($this->^name^);\n}\n\npublic function clear^camel_name^()\n{\n    ^deprecation_trigger^unset($this->^name^);\n}\n\n"
                );
      local_3f0 = FieldDescriptor::name(field);
      name_03._M_len = local_3f0._M_str;
      name_03._M_str = (char *)0x1;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                (&local_3e0,(_anonymous_namespace_ *)local_3f0._M_len,name_03,(bool)uVar10);
      local_400 = FieldDescriptor::name(field);
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                (&local_420,(_anonymous_namespace_ *)field,(FieldDescriptor *)local_400._M_str);
      pbVar11 = &local_3e0;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string,char[37],std::__cxx11::string>
                (printer,local_3c0,(char (*) [11])0xa836ab,pbVar11,(char (*) [5])0xc259cc,&local_400
                 ,(char (*) [14])0xb940c7,&local_420,(char (*) [20])"deprecation_trigger",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (char (*) [37])"deprecation_trigger_with_conditional",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      uVar10 = SUB81(pbVar11,0);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_3e0);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_360,
               "public function has^camel_name^()\n{\n    ^deprecation_trigger^return $this->hasOneof(^number^);\n}\n\n"
              );
    local_390 = FieldDescriptor::name(field);
    name_02._M_len = local_390._M_str;
    name_02._M_str = (char *)0x1;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              (&local_380,(_anonymous_namespace_ *)local_390._M_len,name_02,(bool)uVar10);
    uVar2 = FieldDescriptor::number(field);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&local_3b0,(_anonymous_namespace_ *)(ulong)uVar2,value_01);
    pbVar11 = &local_380;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,local_360,(char (*) [11])0xa836ab,pbVar11,(char (*) [7])0xbe447d,&local_3b0,
               (char (*) [20])"deprecation_trigger",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    uVar10 = SUB81(pbVar11,0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (!bVar1) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_MESSAGE) {
        bVar1 = IsWrapperType(field);
        if (bVar1) {
          GenerateWrapperFieldGetterDocComment(printer,field);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_430,
                     "public function get^camel_name^Unwrapped()\n{\n    ^deprecation_trigger^return $this->readWrapperValue(\"^field_name^\");\n}\n\n"
                    );
          local_460 = FieldDescriptor::name(field);
          name_04._M_len = local_460._M_str;
          name_04._M_str = (char *)0x1;
          php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                    (&local_450,(_anonymous_namespace_ *)local_460._M_len,name_04,(bool)uVar10);
          local_470 = FieldDescriptor::name(field);
          pbVar11 = &local_450;
          io::Printer::
          Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                    (printer,local_430,(char (*) [11])0xa836ab,pbVar11,(char (*) [11])0xaa5115,
                     &local_470,(char (*) [20])"deprecation_trigger",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
          ;
          uVar10 = SUB81(pbVar11,0);
          std::__cxx11::string::~string((string *)&local_450);
        }
      }
    }
  }
  GenerateFieldDocComment(printer,field,options,1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_480,"public function set^camel_name^($var)\n{\n");
  local_4b0 = FieldDescriptor::name(field);
  name_05._M_len = local_4b0._M_str;
  name_05._M_str = (char *)0x1;
  php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            (&local_4a0,(_anonymous_namespace_ *)local_4b0._M_len,name_05,(bool)uVar10);
  pcVar8 = "camel_name";
  pbVar11 = &local_4a0;
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer,local_480,(char (*) [11])0xa836ab,pbVar11);
  uVar10 = SUB81(pbVar11,0);
  std::__cxx11::string::~string((string *)&local_4a0);
  Indent(printer);
  pFVar5 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::deprecated(pFVar5);
  if (bVar1) {
    bVar1 = FieldDescriptor::is_map(field);
    if (!bVar1) {
      bVar1 = FieldDescriptor::is_repeated(field);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&map_entry,
                   "^deprecation_trigger^");
        pcVar8 = "deprecation_trigger";
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
        io::Printer::Print<char[20],std::__cxx11::string>
                  (printer,_map_entry,(char (*) [20])"deprecation_trigger",pbVar11);
        uVar10 = SUB81(pbVar11,0);
      }
    }
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    key = (FieldDescriptor *)FieldDescriptor::message_type(field);
    value = Descriptor::map_key((Descriptor *)key);
    local_4d8 = Descriptor::map_value((Descriptor *)key);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4e8,
               "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
              );
    local_518 = FieldDescriptor::type_name(value);
    s._M_str = pcVar8;
    s._M_len = (size_t)local_518._M_str;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_508,(lts_20250127 *)local_518._M_len,s);
    local_548 = FieldDescriptor::type_name(local_4d8);
    s_00._M_str = pcVar8;
    s_00._M_len = (size_t)local_548._M_str;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_538,(lts_20250127 *)local_548._M_len,s_00)
    ;
    pAVar9 = (AlphaNum *)0xafb626;
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,local_4e8,(char (*) [9])0xafb626,&local_508,(char (*) [11])0xafb71b,
               &local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_508);
    CVar3 = FieldDescriptor::cpp_type(local_4d8);
    if (CVar3 == CPPTYPE_MESSAGE) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_558,", \\^class_name^);\n");
      pDVar6 = FieldDescriptor::message_type(local_4d8);
      FullClassName<google::protobuf::Descriptor>(&local_5c8,pDVar6,options);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_5a8,&local_5c8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_5f8,"::class");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_578,(lts_20250127 *)&local_5a8,&local_5f8,pAVar9)
      ;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,local_558,(char (*) [11])0xb1d2bf,&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_5c8);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(local_4d8);
      if (CVar3 == CPPTYPE_ENUM) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_608,", \\^class_name^);\n");
        pEVar7 = FieldDescriptor::enum_type(local_4d8);
        FullClassName<google::protobuf::EnumDescriptor>(&local_678,pEVar7,options);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_658,&local_678);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_6a8,"::class");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_628,(lts_20250127 *)&local_658,&local_6a8,pAVar9);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,local_608,(char (*) [11])0xb1d2bf,&local_628);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_678);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6b8,");\n");
        io::Printer::Print<>(printer,local_6b8);
      }
    }
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_6c8,
                 "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
                );
      local_6f8 = FieldDescriptor::type_name(field);
      s_01._M_str = pcVar8;
      s_01._M_len = (size_t)local_6f8._M_str;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
                (&local_6e8,(lts_20250127 *)local_6f8._M_len,s_01);
      pAVar9 = (AlphaNum *)0xbe040e;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,local_6c8,(char (*) [5])0xbe040e,&local_6e8);
      std::__cxx11::string::~string((string *)&local_6e8);
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_MESSAGE) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_708,", \\^class_name^);\n");
        pDVar6 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>(&local_778,pDVar6,options);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_758,&local_778);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_7a8,"::class");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_728,(lts_20250127 *)&local_758,&local_7a8,pAVar9);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,local_708,(char (*) [11])0xb1d2bf,&local_728);
        std::__cxx11::string::~string((string *)&local_728);
        std::__cxx11::string::~string((string *)&local_778);
      }
      else {
        CVar3 = FieldDescriptor::cpp_type(field);
        if (CVar3 == CPPTYPE_ENUM) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_7b8,", \\^class_name^);\n");
          pEVar7 = FieldDescriptor::enum_type(field);
          FullClassName<google::protobuf::EnumDescriptor>(&local_828,pEVar7,options);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_808,&local_828);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_858,"::class");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_7d8,(lts_20250127 *)&local_808,&local_858,pAVar9);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,local_7b8,(char (*) [11])0xb1d2bf,&local_7d8);
          std::__cxx11::string::~string((string *)&local_7d8);
          std::__cxx11::string::~string((string *)&local_828);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_868,");\n");
          io::Printer::Print<>(printer,local_868);
        }
      }
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_MESSAGE) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_878,"GPBUtil::checkMessage($var, \\^class_name^::class);\n");
        pDVar6 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>(&local_898,pDVar6,options);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,local_878,(char (*) [11])0xb1d2bf,&local_898);
        std::__cxx11::string::~string((string *)&local_898);
      }
      else {
        CVar3 = FieldDescriptor::cpp_type(field);
        if (CVar3 == CPPTYPE_ENUM) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_8a8,"GPBUtil::checkEnum($var, \\^class_name^::class);\n");
          pEVar7 = FieldDescriptor::enum_type(field);
          FullClassName<google::protobuf::EnumDescriptor>(&local_8c8,pEVar7,options);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,local_8a8,(char (*) [11])0xb1d2bf,&local_8c8);
          std::__cxx11::string::~string((string *)&local_8c8);
        }
        else {
          CVar3 = FieldDescriptor::cpp_type(field);
          if (CVar3 == CPPTYPE_STRING) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_8d8,"GPBUtil::checkString($var, ^utf8^);\n");
            TVar4 = FieldDescriptor::type(field);
            local_8e0 = "False";
            if (TVar4 == TYPE_STRING) {
              local_8e0 = "True";
            }
            io::Printer::Print<char[5],char_const*>
                      (printer,local_8d8,(char (*) [5])0xb14960,&local_8e0);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_8f0,"GPBUtil::check^type^($var);\n");
            local_920 = FieldDescriptor::cpp_type_name(field);
            name_06._M_len = local_920._M_str;
            name_06._M_str = (char *)0x1;
            php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                      (&local_910,(_anonymous_namespace_ *)local_920._M_len,name_06,(bool)uVar10);
            io::Printer::Print<char[5],std::__cxx11::string>
                      (printer,local_8f0,(char (*) [5])0xbe040e,&local_910);
            std::__cxx11::string::~string((string *)&local_910);
          }
        }
      }
    }
  }
  pFVar5 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::deprecated(pFVar5);
  if (bVar1) {
    bVar1 = FieldDescriptor::is_map(field);
    if (!bVar1) {
      bVar1 = FieldDescriptor::is_repeated(field);
      if (!bVar1) goto LAB_0022c36e;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_930,"if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n");
    io::Printer::Print<char[20],std::__cxx11::string>
              (printer,local_930,(char (*) [20])"deprecation_trigger",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
LAB_0022c36e:
  if (deprecation_trigger.field_2._8_8_ == 0) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_970,"$this->^name^ = $arr;\n");
      local_980 = FieldDescriptor::name(field);
      pbVar12 = &local_980;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                (printer,local_970,(char (*) [5])0xc259cc,pbVar12);
      uVar10 = SUB81(pbVar12,0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_990,"$this->^name^ = $var;\n");
      local_9a0 = FieldDescriptor::name(field);
      pbVar12 = &local_9a0;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                (printer,local_990,(char (*) [5])0xc259cc,pbVar12);
      uVar10 = SUB81(pbVar12,0);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_940,"$this->writeOneof(^number^, $var);\n");
    uVar2 = FieldDescriptor::number(field);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&local_960,(_anonymous_namespace_ *)(ulong)uVar2,value_02);
    pbVar11 = &local_960;
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,local_940,(char (*) [7])0xbe447d,pbVar11);
    uVar10 = SUB81(pbVar11,0);
    std::__cxx11::string::~string((string *)&local_960);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9b0,"\nreturn $this;\n");
  io::Printer::Print<>(printer,local_9b0);
  Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9c0,"}\n\n");
  io::Printer::Print<>(printer,local_9c0);
  bVar1 = FieldDescriptor::is_map(field);
  if (!bVar1) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_MESSAGE) {
        bVar1 = IsWrapperType(field);
        if (bVar1) {
          GenerateWrapperFieldSetterDocComment(printer,field);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_9d0,
                     "public function set^camel_name^Unwrapped($var)\n{\n    $this->writeWrapperValue(\"^field_name^\", $var);\n    return $this;}\n\n"
                    );
          local_a00 = FieldDescriptor::name(field);
          name_07._M_len = local_a00._M_str;
          name_07._M_str = (char *)0x1;
          php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                    (&local_9f0,(_anonymous_namespace_ *)local_a00._M_len,name_07,(bool)uVar10);
          local_a10 = FieldDescriptor::name(field);
          io::Printer::
          Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                    (printer,local_9d0,(char (*) [11])0xa836ab,&local_9f0,(char (*) [11])0xaa5115,
                     &local_a10);
          std::__cxx11::string::~string((string *)&local_9f0);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, const Options& options,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->real_containing_oneof();

  // Generate getter.
  GenerateFieldDocComment(printer, field, options, kFieldGetter);

  // deprecation
  std::string deprecation_trigger =
      (field->options().deprecated())
          ? absl::StrCat("@trigger_error('", field->name(),
                         " is deprecated.', E_USER_DEPRECATED);\n        ")
          : "";
  std::string deprecation_trigger_with_conditional =
      (field->options().deprecated())
          ? absl::StrCat("if (" + DeprecatedConditionalForField(field),
                         ") {\n            ", deprecation_trigger,
                         "}\n        ")
          : "";

  // Emit getter.
  if (oneof != nullptr) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence() && !field->message_type()) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ "
        ": ^default_value^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger_with_conditional);
  } else {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Emit hazzers/clear.
  if (oneof) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->hasOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence()) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger_with_conditional^return isset($this->^name^);"
        "\n}\n\n"
        "public function clear^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^unset($this->^name^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger,
        "deprecation_trigger_with_conditional",
        deprecation_trigger_with_conditional);
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    ^deprecation_trigger^return "
        "$this->readWrapperValue(\"^field_name^\");\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, options, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  if (field->options().deprecated() && !field->is_map() &&
      !field->is_repeated()) {
    printer->Print("^deprecation_trigger^", "deprecation_trigger",
                   deprecation_trigger);
  }

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->map_key();
    const FieldDescriptor* value = map_entry->map_value();
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", absl::AsciiStrToUpper(key->type_name()), "value_type",
        absl::AsciiStrToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(value->message_type(), options),
                                  "::class"));
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(value->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", absl::AsciiStrToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(field->message_type(), options),
                                  "::class"));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(field->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print("GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->message_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print("GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->enum_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n", "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True" : "False");
  } else {
    printer->Print("GPBUtil::check^type^($var);\n", "type",
                   UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (field->options().deprecated() &&
      (field->is_map() || field->is_repeated())) {
    printer->Print("if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n",
                   "deprecation_trigger", deprecation_trigger);
  }

  if (oneof != nullptr) {
    printer->Print("$this->writeOneof(^number^, $var);\n", "number",
                   IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print("$this->^name^ = $arr;\n", "name", field->name());
  } else {
    printer->Print("$this->^name^ = $var;\n", "name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print("}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $this->writeWrapperValue(\"^field_name^\", $var);\n"
        "    return $this;"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name());
  }
}